

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_compressSequences
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t srcSize)

{
  void *dst_00;
  BYTE BVar1;
  ZSTD_sequenceFormat_e ZVar2;
  ZSTD_compressedBlockState_t *pZVar3;
  XXH64_hash_t XVar4;
  short sVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  code *pcVar9;
  ulong uVar10;
  xxh_u64 xVar11;
  uint *puVar12;
  ulong uVar13;
  ZSTD_compressedBlockState_t *pZVar14;
  long lVar15;
  size_t err_code_1;
  ulong uVar16;
  ZSTD_compressedBlockState_t *pZVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  size_t err_code_2;
  bool bVar21;
  undefined8 uVar22;
  ulong local_48 [3];
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    __assert_fail("cctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6b4d,
                  "size_t ZSTD_compressSequences(ZSTD_CCtx *, void *, size_t, const ZSTD_Sequence *, size_t, const void *, size_t)"
                 );
  }
  sVar7 = ZSTD_CCtx_init_compressStream2(cctx,ZSTD_e_end,srcSize);
  if (sVar7 < 0xffffffffffffff89) {
    uVar22 = 0x187647;
    pZVar14 = (ZSTD_compressedBlockState_t *)srcSize;
    sVar8 = ZSTD_writeFrameHeader(dst,dstCapacity,&cctx->appliedParams,srcSize,cctx->dictID);
    if ((srcSize != 0) && ((cctx->appliedParams).fParams.checksumFlag != 0)) {
      uVar22 = 0x18766b;
      XXH_INLINE_XXH64_update(&cctx->xxhState,src,srcSize);
    }
    local_48[0] = 0;
    local_48[1] = 0;
    ZVar2 = (cctx->appliedParams).blockDelimiters;
    if (ZSTD_sf_explicitBlockDelimiters < ZVar2) {
      __assert_fail("ZSTD_cParam_withinBounds(ZSTD_c_blockDelimiters, mode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6a88,"ZSTD_sequenceCopier ZSTD_selectSequenceCopier(ZSTD_sequenceFormat_e)");
    }
    if ((ZVar2 & ZSTD_sf_explicitBlockDelimiters) == ZSTD_sf_noBlockDelimiters) {
      pcVar9 = ZSTD_copySequencesToSeqStoreNoBlockDelim;
    }
    else {
      pcVar9 = ZSTD_copySequencesToSeqStoreExplicitBlockDelim;
    }
    pZVar17 = (ZSTD_compressedBlockState_t *)((long)dst + sVar8);
    uVar19 = dstCapacity - sVar8;
    if (srcSize == 0) {
      if (uVar19 < 4) {
        return 0xffffffffffffffba;
      }
      *(undefined4 *)(pZVar17->entropy).huf.CTable = 1;
      uVar16 = 3;
    }
    else {
      uVar16 = 0;
      uVar18 = uVar19;
      do {
        uVar10 = cctx->blockSize;
        if ((cctx->appliedParams).blockDelimiters == ZSTD_sf_noBlockDelimiters) {
          uVar20 = uVar10;
          if (srcSize < uVar10) {
            uVar20 = srcSize;
          }
          bVar21 = srcSize <= uVar10;
          if (0xffffffffffffff88 < uVar20) {
            return uVar20;
          }
        }
        else {
          uVar20 = local_48[0] & 0xffffffff;
          lVar15 = inSeqsSize - uVar20;
          if (inSeqsSize < uVar20) {
            __assert_fail("spos <= inSeqsSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x6a9d,
                          "size_t blockSize_explicitDelimiter(const ZSTD_Sequence *, size_t, ZSTD_sequencePosition)"
                         );
          }
          if (inSeqsSize < uVar20 || lVar15 == 0) {
            return 0xffffffffffffff95;
          }
          puVar12 = &inSeqs[uVar20].matchLength;
          uVar20 = 0;
          while( true ) {
            uVar20 = (puVar12[-1] + *puVar12) + uVar20;
            if (((ZSTD_Sequence *)(puVar12 + -2))->offset == 0) break;
            puVar12 = puVar12 + 4;
            lVar15 = lVar15 + -1;
            if (lVar15 == 0) {
              return 0xffffffffffffff95;
            }
          }
          uVar13 = 0xffffffffffffff95;
          if (*puVar12 == 0) {
            uVar13 = uVar20;
          }
          if (0xffffffffffffff88 < uVar13) {
            return uVar13;
          }
          if (uVar10 < uVar13) {
            return 0xffffffffffffff95;
          }
          bVar21 = uVar13 == srcSize;
          if (srcSize < uVar13) {
            return 0xffffffffffffff95;
          }
        }
        (cctx->seqStore).lit = (cctx->seqStore).litStart;
        (cctx->seqStore).sequences = (cctx->seqStore).sequencesStart;
        (cctx->seqStore).longLengthType = ZSTD_llt_none;
        uVar10 = (*pcVar9)(cctx,local_48,inSeqs,inSeqsSize,src,uVar20,
                           (cctx->appliedParams).searchForExternalRepcodes);
        if (0xffffffffffffff88 < uVar10) {
          return uVar10;
        }
        uVar20 = uVar20 - uVar10;
        sVar5 = (short)uVar20;
        pZVar14 = pZVar17;
        if (uVar20 < 7) {
          uVar10 = uVar20 + 3;
          if (uVar18 < uVar10) {
            return 0xffffffffffffffba;
          }
          *(ushort *)(pZVar17->entropy).huf.CTable = (ushort)bVar21 + sVar5 * 8;
          *(undefined1 *)((long)(pZVar17->entropy).huf.CTable + 2) = 0;
          uVar22 = 0x187834;
          memcpy((void *)((long)(pZVar17->entropy).huf.CTable + 3),src,uVar20);
          uVar16 = uVar16 + uVar10;
        }
        else {
          if (uVar18 < 3) {
            return 0xffffffffffffffba;
          }
          dst_00 = (void *)((long)(pZVar17->entropy).huf.CTable + 3);
          sVar7 = ZSTD_entropyCompressSeqStore
                            (&cctx->seqStore,&((cctx->blockState).prevCBlock)->entropy,
                             &((cctx->blockState).nextCBlock)->entropy,&cctx->appliedParams,dst_00,
                             uVar18 - 3,uVar20,cctx->entropyWorkspace,(ulong)(uint)cctx->bmi2,
                             (int)uVar22);
          if (0xffffffffffffff88 < sVar7) {
            return sVar7;
          }
          if (((cctx->isFirstBlock == 0) &&
              ((ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart) <
               0x20)) &&
             ((ulong)((long)(cctx->seqStore).lit - (long)(cctx->seqStore).litStart) < 10)) {
            uVar22 = 0x187970;
            iVar6 = ZSTD_isRLE((BYTE *)src,uVar20);
            if (iVar6 == 0) goto LAB_001878c8;
LAB_0018797d:
            if (uVar18 == 3) {
              return 0xffffffffffffffba;
            }
            BVar1 = *src;
            *(ushort *)(pZVar17->entropy).huf.CTable = (ushort)bVar21 + sVar5 * 8 + 2;
            pZVar14 = (ZSTD_compressedBlockState_t *)(uVar20 >> 0xd & 0x7ffff);
            *(char *)((long)(pZVar17->entropy).huf.CTable + 2) = (char)pZVar14;
            *(BYTE *)((long)(pZVar17->entropy).huf.CTable + 3) = BVar1;
            uVar10 = 4;
          }
          else {
LAB_001878c8:
            if (sVar7 == 1) goto LAB_0018797d;
            if (sVar7 == 0) {
              uVar10 = uVar20 + 3;
              if (uVar18 < uVar10) {
                return 0xffffffffffffffba;
              }
              *(ushort *)(pZVar17->entropy).huf.CTable = (ushort)bVar21 + sVar5 * 8;
              *(char *)((long)(pZVar17->entropy).huf.CTable + 2) = (char)(uVar20 >> 0xd);
              uVar22 = 0x187912;
              memcpy(dst_00,src,uVar20);
              if (0xffffffffffffff88 < uVar10) {
                return uVar10;
              }
            }
            else {
              pZVar14 = (cctx->blockState).prevCBlock;
              pZVar3 = (cctx->blockState).nextCBlock;
              (cctx->blockState).prevCBlock = pZVar3;
              (cctx->blockState).nextCBlock = pZVar14;
              if ((pZVar3->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
                (pZVar3->entropy).fse.offcode_repeatMode = FSE_repeat_check;
              }
              *(ushort *)(pZVar17->entropy).huf.CTable = (ushort)bVar21 + (short)sVar7 * 8 + 4;
              *(char *)((long)(pZVar17->entropy).huf.CTable + 2) = (char)(sVar7 >> 0xd);
              uVar10 = sVar7 + 3;
            }
          }
          uVar16 = uVar16 + uVar10;
          if (bVar21 != false) break;
          cctx->isFirstBlock = 0;
        }
        uVar18 = uVar18 - uVar10;
        src = (void *)((long)src + uVar20);
        pZVar17 = (ZSTD_compressedBlockState_t *)((long)(pZVar17->entropy).huf.CTable + uVar10);
        srcSize = srcSize - uVar20;
      } while (srcSize != 0);
      if (0xffffffffffffff88 < uVar16) {
        return uVar16;
      }
    }
    sVar8 = sVar8 + uVar16;
    sVar7 = sVar8;
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      uVar18 = (cctx->xxhState).total_len;
      if (uVar18 < 0x20) {
        lVar15 = (cctx->xxhState).v[2] + 0x27d4eb2f165667c5;
      }
      else {
        XVar4 = (cctx->xxhState).v[0];
        uVar10 = (cctx->xxhState).v[1];
        uVar20 = (cctx->xxhState).v[2];
        uVar13 = (cctx->xxhState).v[3];
        pZVar14 = (ZSTD_compressedBlockState_t *)
                  (((uVar10 * -0x6c158a5880000000 | uVar10 * -0x3d4d51c2d82b14b1 >> 0x21) *
                    -0x61c8864e7a143579 ^
                   ((XVar4 * -0x6c158a5880000000 | XVar4 * -0x3d4d51c2d82b14b1 >> 0x21) *
                    -0x61c8864e7a143579 ^
                   (uVar13 << 0x12 | uVar13 >> 0x2e) + (uVar20 << 0xc | uVar20 >> 0x34) +
                   (uVar10 << 7 | uVar10 >> 0x39) + (XVar4 << 1 | (ulong)((long)XVar4 < 0))) *
                   -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
                  0x85ebca77c2b2ae63);
        lVar15 = ((uVar13 * -0x6c158a5880000000 | uVar13 * -0x3d4d51c2d82b14b1 >> 0x21) *
                  -0x61c8864e7a143579 ^
                 ((uVar20 * -0x6c158a5880000000 | uVar20 * -0x3d4d51c2d82b14b1 >> 0x21) *
                  -0x61c8864e7a143579 ^ (ulong)pZVar14) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63)
                 * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
      }
      xVar11 = XXH64_finalize(lVar15 + uVar18,(xxh_u8 *)(cctx->xxhState).mem64,uVar18,
                              (XXH_alignment)pZVar14);
      sVar7 = 0xffffffffffffffba;
      if (3 < uVar19 - uVar16) {
        *(int *)((long)dst + sVar8) = (int)xVar11;
        sVar7 = sVar8 + 4;
      }
    }
  }
  return sVar7;
}

Assistant:

size_t ZSTD_compressSequences(ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                              const ZSTD_Sequence* inSeqs, size_t inSeqsSize,
                              const void* src, size_t srcSize)
{
    BYTE* op = (BYTE*)dst;
    size_t cSize = 0;
    size_t compressedBlocksSize = 0;
    size_t frameHeaderSize = 0;

    /* Transparent initialization stage, same as compressStream2() */
    DEBUGLOG(4, "ZSTD_compressSequences (dstCapacity=%zu)", dstCapacity);
    assert(cctx != NULL);
    FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, ZSTD_e_end, srcSize), "CCtx initialization failed");
    /* Begin writing output, starting with frame header */
    frameHeaderSize = ZSTD_writeFrameHeader(op, dstCapacity, &cctx->appliedParams, srcSize, cctx->dictID);
    op += frameHeaderSize;
    dstCapacity -= frameHeaderSize;
    cSize += frameHeaderSize;
    if (cctx->appliedParams.fParams.checksumFlag && srcSize) {
        XXH64_update(&cctx->xxhState, src, srcSize);
    }
    /* cSize includes block header size and compressed sequences size */
    compressedBlocksSize = ZSTD_compressSequences_internal(cctx,
                                                           op, dstCapacity,
                                                           inSeqs, inSeqsSize,
                                                           src, srcSize);
    FORWARD_IF_ERROR(compressedBlocksSize, "Compressing blocks failed!");
    cSize += compressedBlocksSize;
    dstCapacity -= compressedBlocksSize;

    if (cctx->appliedParams.fParams.checksumFlag) {
        U32 const checksum = (U32) XXH64_digest(&cctx->xxhState);
        RETURN_ERROR_IF(dstCapacity<4, dstSize_tooSmall, "no room for checksum");
        DEBUGLOG(4, "Write checksum : %08X", (unsigned)checksum);
        MEM_writeLE32((char*)dst + cSize, checksum);
        cSize += 4;
    }

    DEBUGLOG(4, "Final compressed size: %zu", cSize);
    return cSize;
}